

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

Move io::parseMove(string *input,Board *pos)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  pointer pcVar5;
  char *pcVar6;
  undefined4 *puVar7;
  pointer pMVar8;
  ulong uVar9;
  Move MVar10;
  bool bVar11;
  _Vector_base<board::Move,_std::allocator<board::Move>_> local_60;
  MoveList movelist;
  
  if (3 < input->_M_string_length) {
    pcVar6 = (char *)std::__cxx11::string::at((ulong)input);
    cVar1 = *pcVar6;
    pcVar6 = (char *)std::__cxx11::string::at((ulong)input);
    cVar2 = *pcVar6;
    pcVar5 = (input->_M_dataplus)._M_p;
    cVar3 = pcVar5[2];
    cVar4 = pcVar5[3];
    search::movegen::generateAll(&movelist,pos,false);
    std::vector<board::Move,_std::allocator<board::Move>_>::vector
              ((vector<board::Move,_std::allocator<board::Move>_> *)&local_60,&movelist.moves);
    MVar10.value = 0;
    MVar10.score = 0;
    uVar9 = 0;
    for (pMVar8 = local_60._M_impl.super__Vector_impl_data._M_start;
        pMVar8 != local_60._M_impl.super__Vector_impl_data._M_finish; pMVar8 = pMVar8 + 1) {
      MVar10 = *pMVar8;
      uVar9 = (ulong)MVar10 >> 0x20;
      if (((MVar10.value & 0x7fU) == cVar1 + -0x236 + cVar2 * 10) &&
         (((uint)((ulong)MVar10 >> 7) & 0x7f) == cVar3 + -0x236 + cVar4 * 10)) {
        if (((ulong)MVar10 >> 0x14 & 0xf) == 0) break;
        if (4 < input->_M_string_length) {
          switch(board::Board::PIECE_NO_TEAM[(uint)((ulong)MVar10 >> 0x14) & 0xf]) {
          case 2:
            pcVar6 = (char *)std::__cxx11::string::at((ulong)input);
            bVar11 = *pcVar6 == 'n';
            break;
          case 3:
            pcVar6 = (char *)std::__cxx11::string::at((ulong)input);
            bVar11 = *pcVar6 == 'b';
            break;
          case 4:
            pcVar6 = (char *)std::__cxx11::string::at((ulong)input);
            bVar11 = *pcVar6 == 'r';
            break;
          case 5:
            pcVar6 = (char *)std::__cxx11::string::at((ulong)input);
            bVar11 = *pcVar6 == 'q';
            break;
          default:
            goto switchD_001044b3_default;
          }
          if (bVar11) break;
        }
      }
switchD_001044b3_default:
    }
    std::_Vector_base<board::Move,_std::allocator<board::Move>_>::~_Vector_base(&local_60);
    std::_Vector_base<board::Move,_std::allocator<board::Move>_>::~_Vector_base
              ((_Vector_base<board::Move,_std::allocator<board::Move>_> *)&movelist);
    if (pMVar8 != local_60._M_impl.super__Vector_impl_data._M_finish) {
      return (Move)((ulong)MVar10 & 0xffffffff | uVar9 << 0x20);
    }
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

board::Move io::parseMove(const std::string& input, board::Board& pos)
{
    if (input.length() > 3) {
        int from = board::Board::FR2SQ(input.at(0) - 'a', input.at(1) - '1');
        int to = board::Board::FR2SQ(input[2] - 'a', input[3] - '1');
        int promoted = 0;
        search::MoveList movelist = search::movegen::generateAll(pos, false);
        for (board::Move move : movelist.getMoves()) {
            if (board::Move::FROMSQ(move.getValue()) == from && board::Move::TOSQ(move.getValue()) == to) {
                promoted = board::Move::PROMOTED(move.getValue());
                if (promoted == board::EMPTY) {
                    return move;
                }
                if (input.length() > 4) {
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WR && input.at(4) == 'r') {
                        return move;
                    }
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WB && input.at(4) == 'b') {
                        return move;
                    }
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WQ && input.at(4) == 'q') {
                        return move;
                    }
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WN && input.at(4) == 'n') {
                        return move;
                    }
                }
            }
        }
    }
    throw 0;
}